

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O0

void __thiscall QFontCache::timerEvent(QFontCache *this,QTimerEvent *param_2)

{
  long in_RDI;
  QFontCache *in_stack_00000068;
  
  if ((*(uint *)(in_RDI + 0x2c) < *(uint *)(in_RDI + 0x28)) || (0x1000 < *(uint *)(in_RDI + 0x2c)))
  {
    decreaseCache(in_stack_00000068);
  }
  else {
    QBasicTimer::stop();
    *(undefined1 *)(in_RDI + 0x34) = 0;
  }
  return;
}

Assistant:

void QFontCache::timerEvent(QTimerEvent *)
{
    FC_DEBUG("QFontCache::timerEvent: performing cache maintenance (timestamp %u)",
              current_timestamp);

    if (total_cost <= max_cost && max_cost <= min_cost) {
        FC_DEBUG("  cache redused sufficiently, stopping timer");

        timer.stop();
        fast = false;

        return;
    }
    decreaseCache();
}